

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void __thiscall RegexTree::RegexTree(RegexTree *this,char *str)

{
  tree_node *ptVar1;
  size_t sVar2;
  int len;
  char *str_local;
  RegexTree *this_local;
  
  ptVar1 = (tree_node *)operator_new(0x18);
  tree_node::tree_node(ptVar1);
  this->root = ptVar1;
  this->root->c = '\b';
  ptVar1 = (tree_node *)operator_new(0x18);
  tree_node::tree_node(ptVar1);
  this->root->right = ptVar1;
  this->root->right->c = '\x0f';
  sVar2 = strlen(str);
  ptVar1 = build_block(this,str,(int)sVar2);
  this->root->left = ptVar1;
  ptVar1 = clean_block(this,this->root->left);
  this->root->left = ptVar1;
  return;
}

Assistant:

RegexTree::RegexTree(const char *str) {
    root = new tree_node;
    root->c = CAT;
    root->right = new tree_node;
    root->right->c = ACCEPT;

    int len = static_cast<int>(strlen(str));
    root->left = build_block(str, len);
    root->left = clean_block(root->left);
}